

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.cpp
# Opt level: O0

uchar * Tools::YUV2RGB(uchar *YUVData,uint dataSize)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uchar *puVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  uint local_54;
  uint local_50;
  uint j;
  uint i_1;
  uint i;
  uchar *V_Weight_r;
  uchar *U_Weight_r;
  uchar *Y_Weight_r;
  uint V_sum;
  uint U_sum;
  uint Y_sum;
  uchar *BGR_Vector;
  uint dataSize_local;
  uchar *YUVData_local;
  
  puVar4 = (uchar *)operator_new__((ulong)(dataSize << 1));
  uVar1 = dataSize / 6;
  uVar2 = uVar1 * 4;
  uVar3 = dataSize / 6;
  pvVar5 = operator_new__((ulong)uVar2);
  pvVar6 = operator_new__((ulong)uVar3);
  pvVar7 = operator_new__((ulong)(dataSize / 6));
  for (j = 0; j < dataSize; j = j + 1) {
    if (j < uVar2) {
      *(uchar *)((long)pvVar5 + (ulong)j) = YUVData[j];
    }
    else if (j < uVar2 + uVar3) {
      *(uchar *)((long)pvVar6 + (ulong)(j + uVar1 * -4)) = YUVData[j];
    }
    else {
      *(uchar *)((long)pvVar7 + (ulong)((j + uVar1 * -4) - uVar3)) = YUVData[j];
    }
  }
  for (local_50 = 0; local_50 < dataSize / 6; local_50 = local_50 + 1) {
    for (local_54 = local_50 << 2; local_54 < local_50 * 4 + 4; local_54 = local_54 + 1) {
      puVar4[local_54 * 3] =
           (uchar)(int)((double)(int)(*(byte *)((long)pvVar6 + (ulong)local_50) - 0x80) * 1.772 +
                       (double)*(byte *)((long)pvVar5 + (ulong)local_54));
      puVar4[local_54 * 3 + 1] =
           (uchar)(int)((double)(int)(*(byte *)((long)pvVar7 + (ulong)local_50) - 0x80) * -0.71414 +
                       (double)(int)(*(byte *)((long)pvVar6 + (ulong)local_50) - 0x80) * -0.34414 +
                       (double)*(byte *)((long)pvVar5 + (ulong)local_54));
      puVar4[local_54 * 3 + 2] =
           (uchar)(int)((double)(int)(*(byte *)((long)pvVar7 + (ulong)local_50) - 0x80) * 1.402 +
                       (double)*(byte *)((long)pvVar5 + (ulong)local_54));
    }
  }
  return puVar4;
}

Assistant:

uchar * Tools::YUV2RGB(uchar * YUVData, uint dataSize){

	uchar * BGR_Vector = new uchar[dataSize*2];
	uint Y_sum = 4 * (dataSize / 6), U_sum = dataSize / 6, V_sum = dataSize / 6;
	
	uchar * Y_Weight_r = new uchar[Y_sum];
	uchar * U_Weight_r = new uchar[U_sum];
	uchar * V_Weight_r = new uchar[V_sum];
	for(uint i = 0; i < dataSize; i++){
		if(i < Y_sum){
			Y_Weight_r[i] = YUVData[i];
		}else if(i < Y_sum+U_sum){
			U_Weight_r[i-Y_sum] = YUVData[i];
		}else{
			V_Weight_r[i-Y_sum-U_sum] = YUVData[i];
		}
	}


	for(uint i = 0; i < V_sum; i++){
		for(uint j = i * 4; j < i * 4 + 4; j++){

			BGR_Vector[3*j] = uchar(int(Y_Weight_r[j])+ 1.772*(int(U_Weight_r[i])-128));
	
			BGR_Vector[3*j+1] = uchar(int(Y_Weight_r[j])-0.34414*(int(U_Weight_r[i])-128)-0.71414*(int(V_Weight_r[i])-128));

			BGR_Vector[3*j+2] = uchar(int(Y_Weight_r[j])+1.402*(int(V_Weight_r[i])-128));
		}
	}
	return BGR_Vector;
}